

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O0

Regexp * __thiscall
re2::CoalesceWalker::PostVisit
          (CoalesceWalker *this,Regexp *re,Regexp *parent_arg,Regexp *pre_arg,Regexp **child_args,
          int nchild_args)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  RegexpOp RVar4;
  int iVar5;
  Regexp **ppRVar6;
  Regexp *in_RSI;
  long in_R8;
  int j;
  int i_5;
  Regexp **nre_subs;
  Regexp *nre;
  int i_4;
  int n;
  int i_3;
  int i_2;
  Regexp **nre_subs_2;
  Regexp *nre_2;
  int i_1;
  bool can_coalesce;
  int i;
  Regexp **nre_subs_1;
  Regexp *nre_1;
  Regexp **in_stack_00000278;
  Regexp **in_stack_00000280;
  ParseFlags in_stack_fffffffffffffed8;
  RegexpOp in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  Regexp *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  Regexp *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  int local_a0;
  int local_9c;
  int local_88;
  int local_80;
  int local_7c;
  int local_64;
  int local_5c;
  Regexp *local_8;
  
  iVar3 = Regexp::nsub(in_RSI);
  if (iVar3 == 0) {
    local_8 = Regexp::Incref(in_stack_ffffffffffffff18);
  }
  else {
    RVar4 = Regexp::op(in_RSI);
    if (RVar4 == kRegexpConcat) {
      bVar1 = false;
      for (local_64 = 0; iVar3 = Regexp::nsub(in_RSI), local_64 < iVar3; local_64 = local_64 + 1) {
        in_stack_ffffffffffffff34 = local_64 + 1;
        iVar3 = Regexp::nsub(in_RSI);
        if ((in_stack_ffffffffffffff34 < iVar3) &&
           (bVar2 = CanCoalesce(in_stack_fffffffffffffef8,
                                (Regexp *)
                                CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)),
           bVar2)) {
          bVar1 = true;
          break;
        }
      }
      if (bVar1) {
        for (local_80 = 0; iVar3 = Regexp::nsub(in_RSI), local_80 < iVar3; local_80 = local_80 + 1)
        {
          iVar3 = local_80 + 1;
          iVar5 = Regexp::nsub(in_RSI);
          if ((iVar3 < iVar5) &&
             (bVar1 = CanCoalesce(in_stack_fffffffffffffef8,
                                  (Regexp *)
                                  CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)),
             bVar1)) {
            DoCoalesce(in_stack_00000280,in_stack_00000278);
          }
        }
        local_88 = 0;
        while (iVar3 = local_88, iVar5 = Regexp::nsub(in_RSI), iVar3 < iVar5) {
          Regexp::op(*(Regexp **)(in_R8 + (long)local_88 * 8));
          local_88 = local_88 + 1;
        }
        local_8 = (Regexp *)operator_new(0x28);
        Regexp::op(in_RSI);
        Regexp::parse_flags(in_RSI);
        Regexp::Regexp((Regexp *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
        Regexp::nsub(in_RSI);
        Regexp::AllocSub((Regexp *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         in_stack_fffffffffffffedc);
        ppRVar6 = Regexp::sub(local_8);
        local_9c = 0;
        local_a0 = 0;
        while (iVar3 = local_9c, iVar5 = Regexp::nsub(in_RSI), iVar3 < iVar5) {
          RVar4 = Regexp::op(*(Regexp **)(in_R8 + (long)local_9c * 8));
          if (RVar4 == kRegexpEmptyMatch) {
            Regexp::Decref((Regexp *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
          }
          else {
            ppRVar6[local_a0] = *(Regexp **)(in_R8 + (long)local_9c * 8);
            local_a0 = local_a0 + 1;
          }
          local_9c = local_9c + 1;
        }
      }
      else {
        bVar1 = ChildArgsChanged((Regexp *)
                                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                                 (Regexp **)
                                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
        if (bVar1) {
          local_8 = (Regexp *)operator_new(0x28);
          Regexp::op(in_RSI);
          Regexp::parse_flags(in_RSI);
          Regexp::Regexp((Regexp *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
          Regexp::nsub(in_RSI);
          Regexp::AllocSub((Regexp *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           in_stack_fffffffffffffedc);
          ppRVar6 = Regexp::sub(local_8);
          for (local_7c = 0; iVar3 = Regexp::nsub(in_RSI), local_7c < iVar3; local_7c = local_7c + 1
              ) {
            ppRVar6[local_7c] = *(Regexp **)(in_R8 + (long)local_7c * 8);
          }
        }
        else {
          local_8 = Regexp::Incref(in_stack_ffffffffffffff18);
        }
      }
    }
    else {
      bVar1 = ChildArgsChanged((Regexp *)
                               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                               (Regexp **)
                               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      if (bVar1) {
        local_8 = (Regexp *)operator_new(0x28);
        Regexp::op(in_RSI);
        Regexp::parse_flags(in_RSI);
        Regexp::Regexp((Regexp *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
        Regexp::nsub(in_RSI);
        Regexp::AllocSub((Regexp *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         in_stack_fffffffffffffedc);
        ppRVar6 = Regexp::sub(local_8);
        for (local_5c = 0; iVar3 = Regexp::nsub(in_RSI), local_5c < iVar3; local_5c = local_5c + 1)
        {
          ppRVar6[local_5c] = *(Regexp **)(in_R8 + (long)local_5c * 8);
        }
        RVar4 = Regexp::op(in_RSI);
        if (RVar4 == kRegexpRepeat) {
          iVar3 = Regexp::min(in_RSI);
          (local_8->field_7).field_0.min_ = iVar3;
          iVar3 = Regexp::max(in_RSI);
          (local_8->field_7).field_0.max_ = iVar3;
        }
        else {
          RVar4 = Regexp::op(in_RSI);
          if (RVar4 == kRegexpCapture) {
            iVar3 = Regexp::cap(in_RSI);
            (local_8->field_7).field_0.max_ = iVar3;
          }
        }
      }
      else {
        local_8 = Regexp::Incref(in_stack_ffffffffffffff18);
      }
    }
  }
  return local_8;
}

Assistant:

Regexp* CoalesceWalker::PostVisit(Regexp* re,
                                  Regexp* parent_arg,
                                  Regexp* pre_arg,
                                  Regexp** child_args,
                                  int nchild_args) {
  if (re->nsub() == 0)
    return re->Incref();

  if (re->op() != kRegexpConcat) {
    if (!ChildArgsChanged(re, child_args))
      return re->Incref();

    // Something changed. Build a new op.
    Regexp* nre = new Regexp(re->op(), re->parse_flags());
    nre->AllocSub(re->nsub());
    Regexp** nre_subs = nre->sub();
    for (int i = 0; i < re->nsub(); i++)
      nre_subs[i] = child_args[i];
    // Repeats and Captures have additional data that must be copied.
    if (re->op() == kRegexpRepeat) {
      nre->min_ = re->min();
      nre->max_ = re->max();
    } else if (re->op() == kRegexpCapture) {
      nre->cap_ = re->cap();
    }
    return nre;
  }

  bool can_coalesce = false;
  for (int i = 0; i < re->nsub(); i++) {
    if (i+1 < re->nsub() &&
        CanCoalesce(child_args[i], child_args[i+1])) {
      can_coalesce = true;
      break;
    }
  }
  if (!can_coalesce) {
    if (!ChildArgsChanged(re, child_args))
      return re->Incref();

    // Something changed. Build a new op.
    Regexp* nre = new Regexp(re->op(), re->parse_flags());
    nre->AllocSub(re->nsub());
    Regexp** nre_subs = nre->sub();
    for (int i = 0; i < re->nsub(); i++)
      nre_subs[i] = child_args[i];
    return nre;
  }

  for (int i = 0; i < re->nsub(); i++) {
    if (i+1 < re->nsub() &&
        CanCoalesce(child_args[i], child_args[i+1]))
      DoCoalesce(&child_args[i], &child_args[i+1]);
  }
  // Determine how many empty matches were left by DoCoalesce.
  int n = 0;
  for (int i = n; i < re->nsub(); i++) {
    if (child_args[i]->op() == kRegexpEmptyMatch)
      n++;
  }
  // Build a new op.
  Regexp* nre = new Regexp(re->op(), re->parse_flags());
  nre->AllocSub(re->nsub() - n);
  Regexp** nre_subs = nre->sub();
  for (int i = 0, j = 0; i < re->nsub(); i++) {
    if (child_args[i]->op() == kRegexpEmptyMatch) {
      child_args[i]->Decref();
      continue;
    }
    nre_subs[j] = child_args[i];
    j++;
  }
  return nre;
}